

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O2

string * libtorrent::resolve_redirect_location
                   (string *__return_storage_ptr__,string *referrer,string *location)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  string *psVar4;
  string url;
  error_code ec;
  string local_50;
  
  psVar4 = referrer;
  if (location->_M_string_length == 0) {
LAB_001cbe0e:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
    return __return_storage_ptr__;
  }
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  std::__cxx11::string::string((string *)&local_50,(string *)location);
  parse_url_components
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&url,&local_50,&ec);
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&url);
  std::__cxx11::string::~string((string *)&local_50);
  psVar4 = location;
  if (ec.failed_ == false) goto LAB_001cbe0e;
  std::__cxx11::string::string((string *)&url,(string *)referrer);
  cVar1 = *(location->_M_dataplus)._M_p;
  lVar2 = std::__cxx11::string::find((char *)&url,0x32b650);
  if (cVar1 == '/') {
    if (lVar2 == -1) {
LAB_001cbe82:
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)location);
      goto LAB_001cbead;
    }
    lVar2 = std::__cxx11::string::find((char)&url,0x2f);
    if (lVar2 != -1) {
      std::__cxx11::string::resize((ulong)&url);
    }
    std::__cxx11::string::append((string *)&url);
  }
  else {
    if (lVar2 == -1) goto LAB_001cbe82;
    uVar3 = std::__cxx11::string::rfind((char)&url,0x2f);
    if (uVar3 != 0xffffffffffffffff && lVar2 + 2U < uVar3) {
      std::__cxx11::string::resize((ulong)&url);
    }
    ensure_trailing_slash(&url);
    std::__cxx11::string::append((string *)&url);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)url._M_dataplus._M_p == &url.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(url.field_2._M_allocated_capacity._1_7_,url.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = url.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = url._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(url.field_2._M_allocated_capacity._1_7_,url.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = url._M_string_length;
  url._M_string_length = 0;
  url.field_2._M_local_buf[0] = '\0';
  url._M_dataplus._M_p = (pointer)&url.field_2;
LAB_001cbead:
  std::__cxx11::string::~string((string *)&url);
  return __return_storage_ptr__;
}

Assistant:

std::string resolve_redirect_location(std::string referrer
		, std::string location)
	{
		if (location.empty()) return referrer;

		error_code ec;
		using std::ignore;
		std::tie(ignore, ignore, ignore, ignore, ignore)
			= parse_url_components(location, ec);

		// if location is a full URL, just return it
		if (!ec) return location;

		// otherwise it's likely to be just the path, or a relative path
		std::string url = referrer;

		if (location[0] == '/')
		{
			// it's an absolute path. replace the path component of
			// referrer with location.

			// first skip the url scheme of the referer
			std::size_t i = url.find("://");

			// if the referrer doesn't appear to have a proper URL scheme
			// just return the location verbatim (and probably fail)
			if (i == std::string::npos)
				return location;

			// then skip the hostname and port, it's fine for this to fail, in
			// case the referrer doesn't have a path component, it's just the
			// url-scheme and hostname, in which case we just append the location
			i = url.find_first_of('/', i + 3);
			if (i != std::string::npos)
				url.resize(i);

			url += location;
		}
		else
		{
			// some web servers send out relative paths
			// in the location header.

			// remove the leaf filename
			// first skip the url scheme of the referer
			std::size_t start = url.find("://");

			// the referrer is not a valid full URL
			if (start == std::string::npos)
				return location;

			std::size_t end = url.find_last_of('/');
			// if the / we find is part of the scheme, there is no / in the path
			// component or hostname.
			if (end <= start + 2) end = std::string::npos;

			// if this fails, the referrer is just url-scheme and hostname. We can
			// just append the location to it.
			if (end != std::string::npos)
				url.resize(end);

			// however, we may still need to insert a '/' in case neither side
			// has one. We know the location doesn't start with a / already.
			// so, if the referrer doesn't end with one, add it.
			ensure_trailing_slash(url);
			url += location;
		}
		return url;
	}